

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::RegisterGenome(Model *this,Ptr *genome)

{
  element_type *peVar1;
  SpeciesTracker *inst;
  Ptr PStack_28;
  
  std::__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Genome,void>
            ((__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2> *)&PStack_28,
             &genome->super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>);
  RegisterPolymer(this,&PStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&PStack_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = (genome->super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  inst = SpeciesTracker::Instance();
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::ConnectMember<SpeciesTracker>(&(peVar1->super_Polymer).termination_signal_,inst,0x120b84);
  Signal<std::shared_ptr<Transcript>_>::ConnectMember<Model>
            (&((genome->super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              transcript_signal_,this,0x12451c);
  std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>::push_back
            (&this->genomes_,genome);
  return;
}

Assistant:

void Model::RegisterGenome(Genome::Ptr genome) {
  RegisterPolymer(genome);
  genome->termination_signal_.ConnectMember(
      &SpeciesTracker::Instance(), &SpeciesTracker::TerminateTranscription);
  genome->transcript_signal_.ConnectMember(this, &Model::RegisterTranscript);
  genomes_.push_back(genome);
}